

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O1

void __thiscall slang::SVInt::SVInt(SVInt *this,bitwidth_t bits,uint64_t value,bool isSigned)

{
  (this->super_SVIntStorage).field_0.val = 0;
  (this->super_SVIntStorage).bitWidth = bits;
  (this->super_SVIntStorage).signFlag = isSigned;
  (this->super_SVIntStorage).unknownFlag = false;
  if (bits < 0x41) {
    (this->super_SVIntStorage).field_0.val = value;
  }
  else {
    initSlowCase(this,value);
  }
  clearUnusedBits(this);
  return;
}

Assistant:

SVInt(bitwidth_t bits, uint64_t value, bool isSigned) : SVIntStorage(bits, isSigned, false) {
        SLANG_ASSERT(bits > 0 && bits <= MAX_BITS);
        if (isSingleWord())
            val = value;
        else
            initSlowCase(value);
        clearUnusedBits();
    }